

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

void * ask_out(void)

{
  char local_9 [8];
  char c;
  
  do {
    __isoc99_scanf("%c",local_9);
  } while (local_9[0] != 'q');
  printf("Closing server ...\n");
  server_deinit();
  exit(0);
}

Assistant:

void *ask_out() {
    while (1) {
        char c;
        scanf("%c", &c);
        if (c == 'q') {
            printf("Closing server ...\n");
            server_deinit();
            exit(0);
        }

    }
}